

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_server.h
# Opt level: O2

void __thiscall
rest_rpc::rpc_service::rpc_server::publish<char_const*>(rpc_server *this,string *key,char *data)

{
  allocator local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)key);
  std::__cxx11::string::string((string *)&local_50,"",&local_51);
  publish<char_const*>(this,&local_30,&local_50,data);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void publish(const std::string &key, T data) {
    publish(key, "", std::move(data));
  }